

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O3

ssize_t __thiscall
twitter::zipkin::thrift::ZipkinCollector_submitZipkinBatch_result::read
          (ZipkinCollector_submitZipkinBatch_result *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
  *this_00;
  pointer pRVar1;
  pointer pRVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  TProtocol *this_01;
  long lVar7;
  pointer pRVar8;
  uint32_t _size30;
  int16_t fid;
  TType ftype;
  string fname;
  TType _etype33;
  uint local_6c;
  short local_66;
  int local_64;
  ZipkinCollector_submitZipkinBatch_result *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [20];
  undefined1 local_34 [4];
  
  this_01 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_01);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  iVar3 = (*this_01->_vptr_TProtocol[0x19])(this_01,&local_58);
  this_00 = &this->success;
  local_60 = this;
  do {
    iVar4 = (*this_01->_vptr_TProtocol[0x1b])(this_01,&local_58,&local_64,&local_66);
    iVar4 = iVar4 + iVar3;
    if (local_64 == 0) {
      iVar3 = (*this_01->_vptr_TProtocol[0x1a])(this_01);
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      this_01->input_recursion_depth_ = this_01->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar4);
    }
    if (local_66 == 0) {
      if (local_64 != 0xf) {
        iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
        goto LAB_002077a7;
      }
      pRVar1 = (this->success).
               super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (this->success).
               super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pRVar8 = pRVar1;
      if (pRVar2 != pRVar1) {
        do {
          (*(code *)**(undefined8 **)pRVar8)(pRVar8);
          pRVar8 = pRVar8 + 1;
        } while (pRVar8 != pRVar2);
        (local_60->success).
        super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
        ._M_impl.super__Vector_impl_data._M_finish = pRVar1;
      }
      iVar3 = (*this_01->_vptr_TProtocol[0x1f])(this_01,local_34,&local_6c);
      std::
      vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
      ::resize(this_00,(ulong)local_6c);
      this = local_60;
      iVar3 = iVar3 + iVar4;
      if (local_6c != 0) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          pRVar1 = (this_00->
                   super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar4 = (**(code **)(*(long *)(&pRVar1->field_0x0 + lVar7) + 0x10))
                            (&pRVar1->field_0x0 + lVar7,this_01);
          iVar3 = iVar3 + iVar4;
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar6 < local_6c);
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x20])(this_01);
      iVar5 = iVar5 + iVar3;
      this->__isset = (_ZipkinCollector_submitZipkinBatch_result__isset)((byte)this->__isset | 1);
    }
    else {
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
LAB_002077a7:
      iVar5 = iVar5 + iVar4;
    }
    iVar3 = (*this_01->_vptr_TProtocol[0x1c])(this_01);
    iVar3 = iVar3 + iVar5;
  } while( true );
}

Assistant:

uint32_t ZipkinCollector_submitZipkinBatch_result::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 0:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->success.clear();
            uint32_t _size30;
            ::apache::thrift::protocol::TType _etype33;
            xfer += iprot->readListBegin(_etype33, _size30);
            this->success.resize(_size30);
            uint32_t _i34;
            for (_i34 = 0; _i34 < _size30; ++_i34)
            {
              xfer += this->success[_i34].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.success = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}